

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
gvr::anon_unknown_1::VertexNormalIndex::VertexNormalIndex
          (VertexNormalIndex *this,Vector3f *v,Vector3f *tnormal,uint32_t _index)

{
  float in_ECX;
  SVector<float,_3> *in_RDX;
  SVector<float,_3> *in_RSI;
  float *in_RDI;
  float fVar1;
  
  fVar1 = gmath::SVector<float,_3>::operator[](in_RSI,0);
  *in_RDI = fVar1;
  fVar1 = gmath::SVector<float,_3>::operator[](in_RSI,1);
  in_RDI[1] = fVar1;
  fVar1 = gmath::SVector<float,_3>::operator[](in_RSI,2);
  in_RDI[2] = fVar1;
  fVar1 = gmath::SVector<float,_3>::operator[](in_RDX,0);
  in_RDI[3] = fVar1;
  fVar1 = gmath::SVector<float,_3>::operator[](in_RDX,1);
  in_RDI[4] = fVar1;
  fVar1 = gmath::SVector<float,_3>::operator[](in_RDX,2);
  in_RDI[5] = fVar1;
  in_RDI[6] = in_ECX;
  return;
}

Assistant:

VertexNormalIndex(const gmath::Vector3f &v, const gmath::Vector3f &tnormal, uint32_t _index)
  {
    x=v[0];
    y=v[1];
    z=v[2];
    nx=tnormal[0];
    ny=tnormal[1];
    nz=tnormal[2];
    index=_index;
  }